

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

Result Clasp::ClauseCreator::integrate
                 (Solver *s,SharedLiterals *clause,uint32 modeFlags,ConstraintType t)

{
  bool bVar1;
  Status st;
  uint32 uVar2;
  ClauseHead *this;
  uint32 uVar3;
  uint size;
  SharedLiterals *in;
  long *plVar4;
  uint uVar5;
  Result RVar6;
  ClauseRep x;
  Sink shared;
  Literal temp [5];
  Antecedent local_38;
  
  shared.clause = (SharedLiterals *)0x0;
  if ((modeFlags & 0x20) == 0) {
    shared.clause = clause;
  }
  temp[2].rep_ = 0;
  temp[3].rep_ = 0;
  temp[4].rep_ = 0;
  temp[0].rep_ = 2;
  temp[1].rep_ = 2;
  in = clause + 1;
  local_38.data_._0_4_ = t << 0x1c;
  x = prepare(s,(Literal *)in,clause->size_type_ >> 2,(ConstraintInfo *)&local_38,0,temp,5);
  if ((modeFlags & 2) == 0) {
    bVar1 = Solver::allowImplicit(s,&x);
    uVar5 = (uint)bVar1 * 2 + 1;
  }
  else {
    uVar5 = 1;
  }
  st = status(s,&x);
  bVar1 = ignoreClause(s,&x,st,modeFlags);
  if (bVar1) {
    this = (ClauseHead *)0x0;
  }
  else {
    if ((modeFlags >> 9 & 1) == 0) {
      plVar4 = (long *)((s->heuristic_).ptr_ & 0xfffffffffffffffe);
      (**(code **)(*plVar4 + 0x48))(plVar4,s,in,clause->size_type_ >> 2,t);
    }
    if (((x._4_4_ & 0x7ffffffe) < 6) ||
       (((uint)s->shared_->share_ >> 0x14 & 2 - (t == Static)) == 0)) {
      size = x._4_4_ & 0x7fffffff;
      if (uVar5 < size) {
        if (size < 6) {
          this = Clause::newClause(s,&x);
        }
        else {
          this = newUnshared(s,clause,temp,&x.info);
        }
      }
      else {
        SolverStats::addLearnt
                  (&s->stats,size,(uint)x.info.super_ConstraintScore.rep >> 0x1c & Other);
        modeFlags = modeFlags | 1;
        this = (ClauseHead *)0x0;
      }
    }
    else {
      this = mt::SharedLitsClause::newClause
                       (s,clause,&x.info,temp,shared.clause == (SharedLiterals *)0x0);
      shared.clause = (SharedLiterals *)0x0;
    }
    if ((modeFlags & 1) == 0) {
      Solver::addLearnt(s,&this->super_Constraint,x._4_4_ & 0x7fffffff,
                        (uint)x.info.super_ConstraintScore.rep >> 0x1c & Other);
    }
    if ((st & status_asserting) != status_open) {
      local_38.data_ = (uint64)this;
      if (this == (ClauseHead *)0x0) {
        local_38.data_ =
             (uint64)(((ulong)(temp[1].rep_ >> 1 ^ 1) << 0x21) +
                      ((ulong)temp._8_8_ >> 1 & 0x7fffffff ^ 1) * 4 + 1);
      }
      bVar1 = Solver::force(s,temp[0],
                            *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                                     (ulong)(temp[1].rep_ & 0xfffffffc)) >> 4,&local_38,0xffffffff);
      if ((modeFlags & 0x40) != 0 && this != (ClauseHead *)0x0) {
        uVar2 = Solver::countLevels(s,(Literal *)in,
                                    (Literal *)
                                    ((long)&(in->refCount_).super___atomic_base<int>._M_i +
                                    (ulong)(clause->size_type_ & 0xfffffffc)),0x7f);
        uVar3 = 0x7f;
        if (uVar2 < 0x7f) {
          uVar3 = uVar2;
        }
        ClauseHead::resetScore
                  (this,(ScoreType)
                        (uVar3 << 0x14 | (uint)x.info.super_ConstraintScore.rep & 0xfffff));
      }
      st = (uint)bVar1 * 2 + status_unsat;
    }
  }
  Detail::Sink::~Sink(&shared);
  RVar6.status = st;
  RVar6.local = this;
  RVar6._12_4_ = 0;
  return RVar6;
}

Assistant:

ClauseCreator::Result ClauseCreator::integrate(Solver& s, SharedLiterals* clause, uint32 modeFlags, ConstraintType t) {
	assert(!s.hasConflict() && "ClauseCreator::integrate() - precondition violated!");
	Detail::Sink shared( (modeFlags & clause_no_release) == 0 ? clause : 0);
	// determine state of clause
	Literal temp[Clause::MAX_SHORT_LEN]; temp[0] = temp[1] = lit_false();
	ClauseRep x    = prepare(s, clause->begin(), clause->size(), ConstraintInfo(t), 0, temp, Clause::MAX_SHORT_LEN);
	uint32 impSize = (modeFlags & clause_explicit) != 0 || !s.allowImplicit(x) ? 1 : 3;
	Status xs      = status(s, x);
	if (ignoreClause(s, x, xs, modeFlags)) {
		return Result(0, xs);
	}
	Result result(0, xs);
	if ((modeFlags & clause_no_heuristic) == 0) { s.heuristic()->newConstraint(s, clause->begin(), clause->size(), t); }
	if (x.size > Clause::MAX_SHORT_LEN && s.sharedContext()->physicalShare(t)) {
		result.local  = Clause::newShared(s, clause, x.info, temp, shared.clause == 0);
		shared.clause = 0;
	}
	else if (x.size > impSize) {
		result.local  = x.size <= Clause::MAX_SHORT_LEN ? Clause::newClause(s, x) : newUnshared(s, clause, temp, x.info);
	}
	else {
		// unary clause or implicitly shared via binary/ternary implication graph;
		// only check for implication/conflict but do not create
		// a local representation for the clause
		s.stats.addLearnt(x.size, x.info.type());
		modeFlags |= clause_no_add;
	}
	if ((modeFlags & clause_no_add) == 0) { s.addLearnt(result.local, x.size, x.info.type()); }
	if ((xs & (status_unit|status_unsat)) != 0) {
		Antecedent ante = result.local ? Antecedent(result.local) : Antecedent(~temp[1], ~temp[2]);
		uint32 impLevel = s.level(temp[1].var());
		result.status   = s.force(temp[0], impLevel, ante) ? status_unit : status_unsat;
		if (result.local && (modeFlags & clause_int_lbd) != 0) {
			uint32 lbd = s.countLevels(clause->begin(), clause->end());
			result.local->resetScore(makeScore(x.info.activity(), lbd));
		}
	}
	return result;
}